

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void * __thiscall
ctemplate::BaseArena::GetMemoryWithHandle(BaseArena *this,size_t size,Handle *handle)

{
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *pvVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  AllocatedBlock *pAVar5;
  void *extraout_RAX;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  size_t in_RCX;
  long lVar10;
  long extraout_RDX;
  ulong uVar11;
  ulong __n;
  ulong uVar12;
  ulong unaff_R12;
  uint uVar13;
  
  if (handle != (Handle *)0x0) {
    pcVar4 = (char *)GetMemory(this,size,1 << ((byte)this->handle_alignment_bits_ & 0x1f));
    iVar9 = this->blocks_alloced_;
    pvVar1 = this->overflow_blocks_;
    if (pvVar1 == (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                   *)0x0) {
      iVar7 = 0;
    }
    else {
      iVar7 = (int)((ulong)((long)(pvVar1->
                                  super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar1->
                                 super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (iVar7 + iVar9 != 0 && SCARRY4(iVar7,iVar9) == iVar7 + iVar9 < 0) {
      uVar13 = iVar7 + iVar9 + 1;
      do {
        unaff_R12 = (ulong)(uVar13 - 2);
        pAVar5 = IndexToBlock(this,uVar13 - 2);
        pcVar2 = pAVar5->mem;
        lVar10 = (long)pcVar4 - (long)pcVar2;
        if ((pcVar2 <= pcVar4) && (pcVar4 < pcVar2 + pAVar5->size)) goto LAB_0012f6fe;
        uVar13 = uVar13 - 1;
      } while (1 < uVar13);
    }
    GetMemoryWithHandle();
    lVar10 = extraout_RDX;
LAB_0012f6fe:
    uVar11 = lVar10 + (unaff_R12 << ((byte)this->block_size_bits_ & 0x3f)) >>
             ((byte)this->handle_alignment_bits_ & 0x3f);
    if (0xfffffffe < uVar11) {
      uVar11 = 0xffffffff;
    }
    *(int *)handle = (int)uVar11;
    return pcVar4;
  }
  GetMemoryWithHandle();
  uVar13 = (uint)size;
  if (((int)uVar13 < 1) || ((uVar13 + 0x7fffffff & uVar13) != 0)) {
    set_handle_alignment();
LAB_0012f7b0:
    set_handle_alignment();
  }
  else {
    in_RCX = size & 0xffffffff;
    if (in_RCX < this->block_size_) {
      if (this->block_size_ % in_RCX != 0) goto LAB_0012f7ba;
      if (this->freestart_ == this->freestart_when_empty_) {
        pvVar1 = this->overflow_blocks_;
        if (pvVar1 == (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                       *)0x0) {
          iVar9 = 0;
        }
        else {
          iVar9 = (int)((ulong)((long)(pvVar1->
                                      super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar1->
                                     super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 4);
        }
        uVar8 = iVar9 + this->blocks_alloced_;
        in_RCX = (size_t)uVar8;
        if (uVar8 == 1) {
          this->handle_alignment_ = uVar13;
          iVar9 = -1;
          do {
            iVar9 = iVar9 + 1;
          } while (1 << ((byte)iVar9 & 0x1f) < (int)uVar13);
          this->handle_alignment_bits_ = iVar9;
          return extraout_RAX;
        }
      }
      goto LAB_0012f7b0;
    }
  }
  set_handle_alignment();
LAB_0012f7ba:
  set_handle_alignment();
  if ((ulong)*(uint *)size == 0xffffffff) {
    HandleToPointer();
  }
  else {
    uVar12 = (ulong)*(uint *)size << ((byte)this->handle_alignment_bits_ & 0x3f);
    uVar11 = this->block_size_bits_;
    in_RCX = uVar11 & 0xffffffff;
    size = uVar12 >> ((byte)in_RCX & 0x3f);
    pAVar5 = IndexToBlock(this,(int)size);
    if (pAVar5 != (AllocatedBlock *)0x0) {
      return pAVar5->mem + ((uint)uVar12 & ~(-1 << ((byte)uVar11 & 0x1f)));
    }
  }
  HandleToPointer();
  bVar3 = AdjustLastAlloc(this,(void *)size,in_RCX);
  if ((__n < in_RCX) && (!bVar3)) {
    pvVar6 = GetMemory(this,in_RCX,1);
    pvVar6 = memcpy(pvVar6,(void *)size,__n);
    return pvVar6;
  }
  return (uint *)size;
}

Assistant:

void* BaseArena::GetMemoryWithHandle(
    const size_t size, BaseArena::Handle* handle) {
  CHECK(handle != NULL);
  // For efficiency, handles are always allocated aligned to a power of 2.
  void* p = GetMemory(size, (1 << handle_alignment_bits_));
  // Find the index of the block the memory was allocated from. In most
  // cases, this will be the last block, so the following loop will
  // iterate exactly once.
  int block_index;
  const AllocatedBlock* block = NULL;
  for (block_index = block_count() - 1; block_index >= 0; --block_index) {
    block = IndexToBlock(block_index);
    if ((p >= block->mem) && (p < (block->mem + block->size))) {
      break;
    }
  }
  CHECK_GE(block_index, 0) << "Failed to find block that was allocated from";
  CHECK(block != NULL) << "Failed to find block that was allocated from";
  const uint64 offset = reinterpret_cast<char*>(p) - block->mem;
  DCHECK_LT(offset, block_size_);
  DCHECK((offset & ((1 << handle_alignment_bits_) - 1)) == 0);
  DCHECK((block_size_ & ((1 << handle_alignment_bits_) - 1)) == 0);
  uint64 handle_value =
      ((static_cast<uint64>(block_index) << block_size_bits_) + offset) >>
      handle_alignment_bits_;
  if (handle_value >= static_cast<uint64>(0xFFFFFFFF)) {
    // We ran out of space to be able to return a handle, so return an invalid
    // handle.
    handle_value = Handle::kInvalidValue;
  }
  handle->handle_ = static_cast<uint32>(handle_value);
  return p;
}